

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5PorterCreate(void *pCtx,char **azArg,int nArg,Fts5Tokenizer **ppOut)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  Fts5Tokenizer *__s;
  Fts5Tokenizer *pFVar9;
  char **ppcVar10;
  char *pcVar11;
  char **ppcVar12;
  PorterTokenizer *p;
  long in_FS_OFFSET;
  fts5_tokenizer_v2 *pV2;
  void *pUserdata;
  undefined4 *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = 0;
  local_48 = (undefined4 *)0x0;
  if (nArg < 1) {
    pcVar11 = "unicode61";
  }
  else {
    pcVar11 = *azArg;
  }
  iVar8 = sqlite3_initialize();
  if (iVar8 == 0) {
    __s = (Fts5Tokenizer *)sqlite3Malloc(0xa8);
  }
  else {
    __s = (Fts5Tokenizer *)0x0;
  }
  if (__s == (Fts5Tokenizer *)0x0) {
    iVar8 = 7;
  }
  else {
    memset(__s,0,0xa8);
    iVar8 = (**(code **)((long)pCtx + 0x28))(pCtx,pcVar11,&local_40,&local_48);
  }
  if (iVar8 == 0) {
    ppcVar10 = (char **)(ulong)(nArg - 1);
    if (nArg < 1) {
      ppcVar10 = (char **)0x0;
    }
    ppcVar12 = (char **)0x0;
    if ((int)ppcVar10 != 0) {
      ppcVar12 = azArg + 1;
    }
    uVar1 = *local_48;
    uVar2 = local_48[1];
    uVar3 = local_48[2];
    uVar4 = local_48[3];
    uVar5 = local_48[5];
    uVar6 = local_48[6];
    uVar7 = local_48[7];
    *(undefined4 *)(__s + 0x10) = local_48[4];
    *(undefined4 *)(__s + 0x14) = uVar5;
    *(undefined4 *)(__s + 0x18) = uVar6;
    *(undefined4 *)(__s + 0x1c) = uVar7;
    *(undefined4 *)__s = uVar1;
    *(undefined4 *)(__s + 4) = uVar2;
    *(undefined4 *)(__s + 8) = uVar3;
    *(undefined4 *)(__s + 0xc) = uVar4;
    iVar8 = (**(code **)(__s + 8))(local_40,ppcVar12,ppcVar10,__s + 0x20);
  }
  pFVar9 = (Fts5Tokenizer *)0x0;
  if (iVar8 == 0) {
    pFVar9 = __s;
  }
  if ((__s != (Fts5Tokenizer *)0x0) && (iVar8 != 0)) {
    if (*(long *)(__s + 0x20) != 0) {
      (**(code **)(__s + 0x10))();
    }
    sqlite3_free(__s);
    pFVar9 = (Fts5Tokenizer *)0x0;
  }
  *ppOut = pFVar9;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar8;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5PorterCreate(
  void *pCtx,
  const char **azArg, int nArg,
  Fts5Tokenizer **ppOut
){
  fts5_api *pApi = (fts5_api*)pCtx;
  int rc = SQLITE_OK;
  PorterTokenizer *pRet;
  void *pUserdata = 0;
  const char *zBase = "unicode61";
  fts5_tokenizer_v2 *pV2 = 0;

  if( nArg>0 ){
    zBase = azArg[0];
  }

  pRet = (PorterTokenizer*)sqlite3_malloc(sizeof(PorterTokenizer));
  if( pRet ){
    memset(pRet, 0, sizeof(PorterTokenizer));
    rc = pApi->xFindTokenizer_v2(pApi, zBase, &pUserdata, &pV2);
  }else{
    rc = SQLITE_NOMEM;
  }
  if( rc==SQLITE_OK ){
    int nArg2 = (nArg>0 ? nArg-1 : 0);
    const char **az2 = (nArg2 ? &azArg[1] : 0);
    memcpy(&pRet->tokenizer_v2, pV2, sizeof(fts5_tokenizer_v2));
    rc = pRet->tokenizer_v2.xCreate(pUserdata, az2, nArg2, &pRet->pTokenizer);
  }

  if( rc!=SQLITE_OK ){
    fts5PorterDelete((Fts5Tokenizer*)pRet);
    pRet = 0;
  }
  *ppOut = (Fts5Tokenizer*)pRet;
  return rc;
}